

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::generateRefImage
          (DrawTestInstanceBase *this,PixelBufferAccess *access,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colors)

{
  ulong uVar1;
  PrimitiveType primitiveType;
  Renderer renderer;
  Program program;
  VertexAttrib vertexAttribs [2];
  PassthruFragShader fragShader;
  MultisamplePixelBufferAccess colorBuffer;
  PassthruVertShader vertShader;
  RenderTarget renderTarget;
  Renderer local_361;
  Program local_360;
  VertexAttrib local_348;
  undefined8 local_320;
  undefined8 uStack_318;
  pointer local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  FragmentShader local_2f8;
  MultisamplePixelBufferAccess local_2c0;
  RenderState local_298;
  VertexShader local_1b0;
  PrimitiveList local_178;
  DrawCommand local_158;
  RenderTarget local_128;
  
  rr::VertexShader::VertexShader(&local_1b0,2,1);
  local_1b0._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d2ba60;
  *(undefined8 *)
   local_1b0.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_1b0.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&local_2f8,1,1);
  local_2f8._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00d2ba90;
  (local_2f8.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_2f8.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_360.geometryShader = (GeometryShader *)0x0;
  local_360.vertexShader = &local_1b0;
  local_360.fragmentShader = &local_2f8;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_2c0,access);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_298);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_348);
  rr::RenderTarget::RenderTarget
            (&local_128,&local_2c0,(MultisamplePixelBufferAccess *)&local_298,
             (MultisamplePixelBufferAccess *)&local_348);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_348,&local_2c0);
  local_298.cullMode = CULLMODE_NONE;
  local_298.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  local_298.rasterization.winding = WINDING_CCW;
  local_298.rasterization.horizontalFill = FILL_LEFT;
  local_298.rasterization.verticalFill = FILL_BOTTOM;
  local_298.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&local_298.fragOps);
  local_298.point.pointSize = 1.0;
  local_298.viewport.rect.left = 0;
  local_298.viewport.rect.bottom = 0;
  local_298.viewport.rect.width = local_348.instanceDivisor;
  local_298.viewport.rect.height = (int)local_348.pointer;
  local_298.viewport.zn = 0.0;
  local_298.viewport.zf = 1.0;
  local_298.line.lineWidth = 1.0;
  local_298.restart.enabled = false;
  local_298.restart.restartIndex = 0xffffffff;
  local_298.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  local_298.rasterization._8_8_ = local_298.rasterization._8_8_ & 0xffffffff;
  rr::Renderer::Renderer(&local_361);
  local_348.pointer =
       (vertices->super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_348.type = VERTEXATTRIBTYPE_FLOAT;
  local_348.size = 4;
  local_348.stride = 0x10;
  local_348.instanceDivisor = 0;
  local_348.generic.v._0_8_ = 0;
  local_348.generic.v._8_8_ = 0;
  local_310 = (colors->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_320 = 0x400000000;
  uStack_318 = 0x10;
  local_308 = 0;
  uStack_300 = 0;
  uVar1 = (ulong)(this->m_data).topology;
  primitiveType = PRIMITIVETYPE_LAST;
  if (uVar1 < 10) {
    primitiveType = *(PrimitiveType *)(&DAT_00b34e74 + uVar1 * 4);
  }
  rr::PrimitiveList::PrimitiveList
            (&local_178,primitiveType,
             (int)((ulong)((long)(vertices->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_348.pointer) >> 4),0);
  local_158.state = &local_298;
  local_158.renderTarget = &local_128;
  local_158.program = &local_360;
  local_158.numVertexAttribs = 2;
  local_158.vertexAttribs = &local_348;
  local_158.primitives = &local_178;
  rr::Renderer::draw(&local_361,&local_158);
  rr::Renderer::~Renderer(&local_361);
  rr::FragmentShader::~FragmentShader(&local_2f8);
  rr::VertexShader::~VertexShader(&local_1b0);
  return;
}

Assistant:

void DrawTestInstanceBase::generateRefImage (const tcu::PixelBufferAccess& access, const std::vector<tcu::Vec4>& vertices, const std::vector<tcu::Vec4>& colors) const
{
	const PassthruVertShader				vertShader;
	const PassthruFragShader				fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(access);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)));
	const rr::Renderer						renderer;

	const rr::VertexAttrib	vertexAttribs[] =
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &vertices[0]),
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &colors[0])
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(mapVkPrimitiveTopology(m_data.topology), (deUint32)vertices.size(), 0)));
}